

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::SetNavID(ImGuiID id,int nav_layer,ImGuiID focus_scope_id)

{
  ImGuiContext *pIVar1;
  
  pIVar1 = GImGui;
  if (GImGui->NavWindow == (ImGuiWindow *)0x0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x1f5f,"SetNavID","ImGui ASSERT FAILED: %s","g.NavWindow");
  }
  if (1 < (uint)nav_layer) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.cpp"
                ,0x1f60,"SetNavID","ImGui ASSERT FAILED: %s","nav_layer == 0 || nav_layer == 1");
  }
  pIVar1->NavId = id;
  pIVar1->NavFocusScopeId = focus_scope_id;
  pIVar1->NavWindow->NavLastIds[nav_layer] = id;
  return;
}

Assistant:

void ImGui::SetNavID(ImGuiID id, int nav_layer, ImGuiID focus_scope_id)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.NavWindow);
    IM_ASSERT(nav_layer == 0 || nav_layer == 1);
    g.NavId = id;
    g.NavFocusScopeId = focus_scope_id;
    g.NavWindow->NavLastIds[nav_layer] = id;
}